

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::RegisteredLoggers::unsafeFlushAll(RegisteredLoggers *this)

{
  bool bVar1;
  pointer ppVar2;
  element_type *peVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
  local_20;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
  local_18;
  iterator it;
  RegisteredLoggers *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
               )this;
  local_18._M_cur =
       (__node_type *)
       utils::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
       ::begin(&this->m_logStreamsReference);
  while( true ) {
    local_20._M_cur =
         (__node_type *)
         utils::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
         ::end(&this->m_logStreamsReference);
    bVar1 = utils::std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = utils::std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_false,_true>
                           *)&local_18);
    peVar3 = utils::std::
             __shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ::get(&(ppVar2->second).
                    super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    if (peVar3 != (element_type *)0x0) {
      ppVar2 = utils::std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_false,_true>
                             *)&local_18);
      utils::std::
      __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&ppVar2->second);
      std::ostream::flush();
    }
    utils::std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_false,_true>
                  *)&local_18);
  }
  return;
}

Assistant:

void RegisteredLoggers::unsafeFlushAll(void) {
  ELPP_INTERNAL_INFO(1, "Flushing all log files");
  for (base::LogStreamsReferenceMap::iterator it = m_logStreamsReference.begin();
       it != m_logStreamsReference.end(); ++it) {
    if (it->second.get() == nullptr) continue;
    it->second->flush();
  }
}